

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmCommonTargetGenerator::GetManifests_abi_cxx11_
          (string *__return_storage_ptr__,cmCommonTargetGenerator *this)

{
  string *source;
  pointer ppcVar1;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> manifest_srcs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  manifests;
  string local_50;
  
  manifest_srcs.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manifest_srcs.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manifest_srcs.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmGeneratorTarget::GetManifests(this->GeneratorTarget,&manifest_srcs,&this->ConfigName);
  manifests.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manifests.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manifests.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (ppcVar1 = manifest_srcs.
                 super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppcVar1 !=
      manifest_srcs.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppcVar1 = ppcVar1 + 1) {
    source = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar1);
    Convert(&local_50,this,source,this->WorkingDirectory,SHELL);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&manifests,
               &local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (__return_storage_ptr__,&manifests," ");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&manifests);
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            (&manifest_srcs.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCommonTargetGenerator::GetManifests()
{
  std::vector<cmSourceFile const*> manifest_srcs;
  this->GeneratorTarget->GetManifests(manifest_srcs, this->ConfigName);

  std::vector<std::string> manifests;
  for (std::vector<cmSourceFile const*>::iterator mi = manifest_srcs.begin();
       mi != manifest_srcs.end(); ++mi)
    {
    manifests.push_back(this->Convert((*mi)->GetFullPath(),
                                      this->WorkingDirectory,
                                      cmOutputConverter::SHELL));
    }

  return cmJoin(manifests, " ");
}